

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareWithDifferencer
          (SimpleFieldComparator *this,MessageDifferencer *differencer,Message *message1,
          Message *message2,FieldContext *field_context)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *this_00;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view v_00;
  Metadata MVar3;
  Metadata MVar4;
  LogMessage local_40;
  
  MVar3 = Message::GetMetadata(message1);
  MVar4 = Message::GetMetadata(message2);
  if (MVar3.descriptor == MVar4.descriptor) {
    bVar2 = MessageDifferencer::Compare
                      (differencer,message1,message2,0,field_context->parent_fields_);
    return bVar2;
  }
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator.cc"
             ,0x90);
  str._M_str = "Comparison between two messages with different ";
  str._M_len = 0x2f;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
  str_00._M_str = "descriptors. ";
  str_00._M_len = 0xd;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str_00)
  ;
  pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,v);
  str_01._M_str = " vs ";
  str_01._M_len = 4;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_01);
  pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
  v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v_00._M_str = pcVar1 + ~v_00._M_len;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v_00);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_40);
  return false;
}

Assistant:

bool SimpleFieldComparator::CompareWithDifferencer(
    MessageDifferencer* differencer, const Message& message1,
    const Message& message2, const util::FieldContext* field_context) {
  const Descriptor* descriptor1 = message1.GetDescriptor();
  const Descriptor* descriptor2 = message2.GetDescriptor();
  if (descriptor1 != descriptor2) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors. " << descriptor1->full_name() << " vs "
                     << descriptor2->full_name();
    return false;
  }
  return differencer->Compare(message1, message2, false,
                              field_context->parent_fields());
}